

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

bool __thiscall cmCTestP4::IdentifyParser::ProcessLine(IdentifyParser *this)

{
  bool bVar1;
  string local_38;
  IdentifyParser *local_18;
  IdentifyParser *this_local;
  
  local_18 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexIdentify,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_38,&this->RegexIdentify,1);
    std::__cxx11::string::operator=((string *)this->Rev,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexIdentify.find(this->Line))
      {
      this->Rev = this->RegexIdentify.match(1);
      return false;
      }
    return true;
    }